

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O3

void __thiscall
ccs::CcsDomain::CcsDomain(CcsDomain *this,shared_ptr<ccs::CcsLogger> *log,bool logAccesses)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Head_base<0UL,_ccs::DagBuilder_*,_false> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<ccs::CcsTracer> local_40;
  
  this_00._M_head_impl = (DagBuilder *)operator_new(0x28);
  peVar1 = (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015aea8;
  local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
       1);
  local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__LoggingTracer_0015aef8;
  *(element_type **)
   &local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = peVar1;
  local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)p_Var2;
  *(bool *)&local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi[2]._M_use_count = logAccesses;
  DagBuilder::DagBuilder(this_00._M_head_impl,&local_40);
  (this->dag)._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>.
  _M_t.super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl = this_00._M_head_impl;
  if (local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

CcsDomain::CcsDomain(std::shared_ptr<CcsLogger> log, bool logAccesses) :
  dag(new DagBuilder(CcsTracer::makeLoggingTracer(
    std::move(log), logAccesses))) {}